

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dsatur.cpp
# Opt level: O2

void __thiscall Dsatur::assignColor(Dsatur *this,Node *node)

{
  Node *pNVar1;
  pointer ppNVar2;
  uint uVar3;
  allocator_type local_49;
  Node *node_local;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_40;
  
  uVar3 = 1;
  node_local = node;
  do {
    if (this->number_of_colors_used < (int)uVar3) {
LAB_001026cb:
      node->assignedColor = uVar3;
      if (this->number_of_colors_used < (int)uVar3) {
        this->number_of_colors_used = uVar3;
        std::vector<Node_*,_std::allocator<Node_*>_>::vector
                  ((vector<Node_*,_std::allocator<Node_*>_> *)&local_40,1,&node_local,&local_49);
        std::
        vector<std::vector<Node*,std::allocator<Node*>>,std::allocator<std::vector<Node*,std::allocator<Node*>>>>
        ::emplace_back<std::vector<Node*,std::allocator<Node*>>>
                  ((vector<std::vector<Node*,std::allocator<Node*>>,std::allocator<std::vector<Node*,std::allocator<Node*>>>>
                    *)&this->classes,(vector<Node_*,_std::allocator<Node_*>_> *)&local_40);
        std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_40);
      }
      else {
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((this->classes).
                   super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + ((ulong)uVar3 - 1),&node_local);
      }
      return;
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)&local_40,&node->neighbors);
    ppNVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppNVar2 == local_40._M_impl.super__Vector_impl_data._M_finish) {
        std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_40);
        goto LAB_001026cb;
      }
      pNVar1 = *ppNVar2;
      ppNVar2 = ppNVar2 + 1;
    } while (pNVar1->assignedColor != uVar3);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_40);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void Dsatur::assignColor(Node *node) {

    int color = 1;
    for(;color<=number_of_colors_used;color++){
        bool assignIt = true;
        for(auto neighbor:node->getNeighbors()){
            if(neighbor->getAssignedColor()!=-1 && neighbor->getAssignedColor() == color){
                assignIt = false;
                break;
            }
        }

        if(assignIt)
            break;
    }

    node->setAssignedColor(color);

    if(color > number_of_colors_used) {
        number_of_colors_used = color;
        classes.push_back(std::vector<Node*>(1,node));
    }else{
        classes[color-1].push_back(node);
    }

}